

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O2

void __thiscall highs::parallel::TaskGroup::sync(TaskGroup *this)

{
  parallel::sync((parallel *)this->workerDeque);
  return;
}

Assistant:

void sync() const {
    assert(workerDeque->getCurrentHead() > dequeHead);
    highs::parallel::sync(workerDeque);
  }